

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddDependenciesCommand.cxx
# Opt level: O0

bool __thiscall
cmAddDependenciesCommand::InitialPass
          (cmAddDependenciesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  const_iterator this_00;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference u;
  ostream *poVar5;
  string local_3c8;
  undefined1 local_3a8 [8];
  ostringstream e_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  const_iterator s;
  cmTarget *target;
  undefined1 local_1f8 [8];
  ostringstream e;
  undefined1 local_80 [8];
  string target_name;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddDependenciesCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    std::__cxx11::string::string((string *)local_80,(string *)pvVar4);
    bVar2 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,(string *)local_80);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      poVar5 = std::operator<<((ostream *)local_1f8,
                               "Cannot add target-level dependencies to alias target \"");
      poVar5 = std::operator<<(poVar5,(string *)local_80);
      std::operator<<(poVar5,"\".\n");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&target,false);
      std::__cxx11::string::~string((string *)&target);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
    }
    s._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmMakefile::FindTargetToUse
                             ((this->super_cmCommand).Makefile,(string *)local_80,false);
    if ((cmTarget *)s._M_current == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a8);
      poVar5 = std::operator<<((ostream *)local_3a8,
                               "Cannot add target-level dependencies to non-existent target \"");
      poVar5 = std::operator<<(poVar5,(string *)local_80);
      poVar5 = std::operator<<(poVar5,"\".\n");
      poVar5 = std::operator<<(poVar5,
                               "The add_dependencies works for top-level logical targets created ");
      poVar5 = std::operator<<(poVar5,
                               "by the add_executable, add_library, or add_custom_target commands.  "
                              );
      poVar5 = std::operator<<(poVar5,
                               "If you want to add file-level dependencies see the DEPENDS option ")
      ;
      std::operator<<(poVar5,"of the add_custom_target and add_custom_command commands.");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_3c8,false);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a8);
    }
    else {
      local_228._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_228);
      while( true ) {
        local_230._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
        bVar2 = __gnu_cxx::operator!=(&local_228,&local_230);
        this_00 = s;
        if (!bVar2) break;
        u = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&local_228);
        cmTarget::AddUtility((cmTarget *)this_00._M_current,u,(this->super_cmCommand).Makefile);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_228);
      }
    }
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_80);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddDependenciesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string target_name = args[0];
  if(this->Makefile->IsAlias(target_name))
    {
    std::ostringstream e;
    e << "Cannot add target-level dependencies to alias target \""
      << target_name << "\".\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  if(cmTarget* target = this->Makefile->FindTargetToUse(target_name))
    {
    std::vector<std::string>::const_iterator s = args.begin();
    ++s; // skip over target_name
    for (; s != args.end(); ++s)
      {
      target->AddUtility(*s, this->Makefile);
      }
    }
  else
    {
    std::ostringstream e;
    e << "Cannot add target-level dependencies to non-existent target \""
      << target_name << "\".\n"
      << "The add_dependencies works for top-level logical targets created "
      << "by the add_executable, add_library, or add_custom_target commands.  "
      << "If you want to add file-level dependencies see the DEPENDS option "
      << "of the add_custom_target and add_custom_command commands.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }

  return true;
}